

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_disconnect(connectdata *conn,_Bool dead_connection)

{
  anon_union_264_9_0449b319_for_proto *ftpc;
  SessionHandle *data;
  CURLcode CVar1;
  ftpstate fVar2;
  char *pcVar3;
  pingpong *pp;
  undefined7 in_register_00000031;
  
  ftpc = &conn->proto;
  if ((int)CONCAT71(in_register_00000031,dead_connection) == 0) {
    if (((conn->proto).ftpc.ctl_valid & 1U) != 0) {
      CVar1 = Curl_pp_sendf(&(ftpc->ftpc).pp,"%s","QUIT");
      if (CVar1 == CURLE_OK) {
        (conn->proto).ftpc.state = FTP_QUIT;
        fVar2 = FTP_QUIT;
        while (fVar2 != FTP_STOP) {
          CVar1 = Curl_pp_statemach(&(ftpc->ftpc).pp,true);
          if (CVar1 != CURLE_OK) break;
          fVar2 = (conn->proto).ftpc.state;
        }
      }
      else {
        data = conn->data;
        pcVar3 = curl_easy_strerror(CVar1);
        Curl_failf(data,"Failure sending QUIT command: %s",pcVar3);
        (conn->proto).ftpc.ctl_valid = false;
        (conn->bits).close = true;
        (conn->proto).ftpc.state = FTP_STOP;
      }
    }
  }
  else {
    (conn->proto).ftpc.ctl_valid = false;
  }
  pcVar3 = (conn->proto).ftpc.entrypath;
  if (pcVar3 != (char *)0x0) {
    if ((conn->data->state).most_recent_ftp_entrypath == pcVar3) {
      (conn->data->state).most_recent_ftp_entrypath = (char *)0x0;
    }
    (*Curl_cfree)(pcVar3);
    (conn->proto).ftpc.entrypath = (char *)0x0;
  }
  freedirs(&ftpc->ftpc);
  pcVar3 = (conn->proto).ftpc.prevpath;
  if (pcVar3 != (char *)0x0) {
    (*Curl_cfree)(pcVar3);
    (conn->proto).ftpc.prevpath = (char *)0x0;
  }
  pcVar3 = (conn->proto).ftpc.server_os;
  if (pcVar3 != (char *)0x0) {
    (*Curl_cfree)(pcVar3);
    (conn->proto).ftpc.server_os = (char *)0x0;
  }
  Curl_pp_disconnect(&(ftpc->ftpc).pp);
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct ftp_conn *ftpc= &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to.

     ftp_quit() will check the state of ftp->ctl_valid. If it's ok it
     will try to send the QUIT command, otherwise it will just return.
  */
  if(dead_connection)
    ftpc->ctl_valid = FALSE;

  /* The FTP session may or may not have been allocated/setup at this point! */
  (void)ftp_quit(conn); /* ignore errors on the QUIT */

  if(ftpc->entrypath) {
    struct SessionHandle *data = conn->data;
    if(data->state.most_recent_ftp_entrypath == ftpc->entrypath) {
      data->state.most_recent_ftp_entrypath = NULL;
    }
    free(ftpc->entrypath);
    ftpc->entrypath = NULL;
  }

  freedirs(ftpc);
  if(ftpc->prevpath) {
    free(ftpc->prevpath);
    ftpc->prevpath = NULL;
  }
  if(ftpc->server_os) {
    free(ftpc->server_os);
    ftpc->server_os = NULL;
  }

  Curl_pp_disconnect(pp);

#ifdef HAVE_GSSAPI
  Curl_sec_end(conn);
#endif

  return CURLE_OK;
}